

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O0

bool __thiscall ValueType::IsMixedTypedArrayPair(ValueType *this,ValueType other)

{
  bool bVar1;
  ObjectType OVar2;
  ObjectType OVar3;
  bool local_2f;
  bool local_29;
  bool local_19;
  ValueType *this_local;
  ValueType other_local;
  
  this_local._6_2_ = other.field_0;
  bVar1 = IsLikelyObject(this);
  local_19 = false;
  if (bVar1) {
    bVar1 = IsLikelyObject((ValueType *)((long)&this_local + 6));
    local_19 = false;
    if (bVar1) {
      OVar2 = GetObjectType(this);
      OVar2 = MixedTypedArrayPair[(int)(uint)OVar2];
      OVar3 = GetObjectType((ValueType *)((long)&this_local + 6));
      local_29 = true;
      if (OVar2 != OVar3) {
        OVar2 = GetObjectType((ValueType *)((long)&this_local + 6));
        OVar2 = MixedTypedArrayPair[(int)(uint)OVar2];
        OVar3 = GetObjectType(this);
        local_29 = true;
        if (OVar2 != OVar3) {
          bVar1 = IsLikelyMixedTypedArrayType(this);
          local_2f = false;
          if (bVar1) {
            local_2f = IsLikelyMixedTypedArrayType((ValueType *)((long)&this_local + 6));
          }
          local_29 = local_2f;
        }
      }
      local_19 = local_29;
    }
  }
  return local_19;
}

Assistant:

bool ValueType::IsMixedTypedArrayPair(const ValueType other) const
{
    return ( IsLikelyObject() && other.IsLikelyObject() &&
             (    (MixedTypedArrayPair[(int)GetObjectType()] == other.GetObjectType()) ||
                  (MixedTypedArrayPair[(int)other.GetObjectType()] == GetObjectType()) ||
                  (IsLikelyMixedTypedArrayType() && other.IsLikelyMixedTypedArrayType())
             )
           );
}